

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

basic_executor_type<std::allocator<void>,_0UL> * __thiscall
asio::execution::detail::any_executor_base::
target<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(any_executor_base *this)

{
  bool bVar1;
  type_info *__arg;
  type_info *in_RDI;
  
  if (*(long *)(in_RDI + 0x20) != 0) {
    __arg = (type_info *)(*(code *)**(undefined8 **)(in_RDI + 0x28))();
    target_type_ex<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>();
    bVar1 = CLI::std::type_info::operator==(in_RDI,__arg);
    if (bVar1) {
      return *(basic_executor_type<std::allocator<void>,_0UL> **)(in_RDI + 0x20);
    }
  }
  return (basic_executor_type<std::allocator<void>,_0UL> *)0x0;
}

Assistant:

const Executor* target() const
  {
    return target_ && (is_same<Executor, void>::value
        || target_fns_->target_type() == target_type_ex<Executor>())
      ? static_cast<const Executor*>(target_) : 0;
  }